

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int combine_substitute(gen_ctx_t gen_ctx,bb_insn_t_conflict *bb_insn_ref,long *deleted_insns_num)

{
  undefined8 *puVar1;
  MIR_op_t *pMVar2;
  undefined1 auVar3 [32];
  char cVar4;
  MIR_reg_t MVar5;
  MIR_context_t insn;
  VARR_MIR_op_t *pVVar6;
  combine_ctx *pcVar7;
  bitmap_t pVVar8;
  VARR_size_t *pVVar9;
  MIR_item_t pMVar10;
  long lVar11;
  void *pvVar12;
  VARR_MIR_proto_t *pVVar13;
  VARR_uint8_t *pVVar14;
  VARR_uint8_t *pVVar15;
  VARR_uint8_t *pVVar16;
  HTAB_MIR_item_t *pHVar17;
  undefined1 auVar18 [32];
  bb_insn_t_conflict pbVar19;
  int iVar20;
  uint uVar21;
  gen_ctx_t __ptr;
  MIR_insn_t pMVar22;
  VARR_MIR_reg_t *pVVar23;
  size_t *__ptr_00;
  bool bVar24;
  ulong uVar25;
  int *piVar26;
  long extraout_RDX;
  size_t sVar27;
  uint *puVar28;
  size_t nop;
  undefined8 uVar29;
  gen_ctx_t pgVar30;
  long lVar31;
  MIR_op_t *pMVar32;
  bb_insn_t_conflict *ppbVar33;
  int out_p;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_op_t saved_op;
  char cStack_c0;
  int local_bc;
  ulong local_b8;
  bb_insn_t_conflict *local_b0;
  MIR_reg_t local_a8;
  MIR_reg_t local_a4;
  long *local_a0;
  MIR_op_t *local_98;
  undefined8 local_90;
  bb_insn_t_conflict local_88;
  gen_ctx_t local_80;
  MIR_insn_t local_78;
  size_t local_70;
  void *pvStack_68;
  undefined8 uStack_60;
  int64_t local_58;
  char *pcStack_50;
  undefined8 uStack_48;
  MIR_disp_t MStack_40;
  
  local_88 = *bb_insn_ref;
  uVar29 = 0;
  insn = (MIR_context_t)local_88->insn;
  local_b8 = *(ulong *)&insn->func_redef_permission_p >> 0x20;
  if (local_b8 == 0) goto LAB_00170dba;
  pVVar6 = gen_ctx->combine_ctx->last_right_ops;
  pgVar30 = gen_ctx;
  local_b0 = bb_insn_ref;
  if ((pVVar6 == (VARR_MIR_op_t *)0x0) || (pVVar6->varr == (MIR_op_t *)0x0)) {
LAB_00171557:
    combine_substitute_cold_13();
LAB_0017155c:
    combine_substitute_cold_11();
LAB_00171564:
    combine_substitute_cold_10();
LAB_0017156c:
    combine_substitute_cold_6();
  }
  else {
    local_80 = (gen_ctx_t)gen_ctx->ctx;
    pVVar6->els_num = 0;
    lVar31 = 0;
    lVar11 = local_b8 * 0x30;
    local_a0 = deleted_insns_num;
    do {
      puVar1 = (undefined8 *)((long)&((MIR_op_t *)&insn->insn_nops)->data + lVar31);
      pvStack_68 = (void *)*puVar1;
      uStack_60 = puVar1[1];
      local_58 = puVar1[2];
      pcStack_50 = (char *)puVar1[3];
      uStack_48 = *(undefined8 *)((long)&insn->used_label_p + lVar31);
      MStack_40 = *(undefined8 *)((long)&insn->module_item_tab + lVar31);
      pVVar6 = gen_ctx->combine_ctx->last_right_ops;
      __ptr = (gen_ctx_t)pVVar6->varr;
      if (__ptr == (gen_ctx_t)0x0) {
        combine_substitute_cold_12();
        goto LAB_00171508;
      }
      sVar27 = pVVar6->els_num;
      uVar25 = sVar27 + 1;
      if (pVVar6->size < uVar25) {
        sVar27 = (uVar25 >> 1) + uVar25;
        bb_insn_ref = (bb_insn_t_conflict *)(sVar27 * 0x30);
        pgVar30 = __ptr;
        __ptr = (gen_ctx_t)realloc(__ptr,(size_t)bb_insn_ref);
        pVVar6->varr = (MIR_op_t *)__ptr;
        pVVar6->size = sVar27;
        sVar27 = pVVar6->els_num;
        uVar25 = sVar27 + 1;
      }
      pbVar19 = local_88;
      pVVar6->els_num = uVar25;
      lVar31 = lVar31 + 0x30;
      auVar3._8_8_ = uStack_60;
      auVar3._0_8_ = pvStack_68;
      auVar3._16_8_ = local_58;
      auVar3._24_8_ = pcStack_50;
      auVar18._8_8_ = pcStack_50;
      auVar18._0_8_ = local_58;
      auVar18._16_8_ = uStack_48;
      auVar18._24_8_ = MStack_40;
      *(undefined1 (*) [32])(__ptr->call_used_hard_regs + sVar27 * 6 + -0xb) = auVar18;
      *(undefined1 (*) [32])(__ptr->call_used_hard_regs + sVar27 * 6 + -0xd) = auVar3;
    } while (lVar11 != lVar31);
    pcVar7 = gen_ctx->combine_ctx;
    pVVar23 = pcVar7->insn_vars;
    if ((pVVar23 == (VARR_MIR_reg_t *)0x0) || (pVVar23->varr == (MIR_reg_t *)0x0))
    goto LAB_0017155c;
    pVVar23->els_num = 0;
    pVVar8 = pcVar7->vars_bitmap;
    if ((pVVar8 == (bitmap_t)0x0) || (pVVar8->varr == (bitmap_el_t *)0x0)) goto LAB_00171564;
    puVar28 = (uint *)((long)&insn->used_label_p + 4);
    sVar27 = 0;
    pVVar8->els_num = 0;
    do {
      bb_insn_ref = (bb_insn_t_conflict *)insn;
      pgVar30 = local_80;
      MIR_insn_op_mode((MIR_context_t)local_80,(MIR_insn_t_conflict)insn,sVar27,&local_bc);
      if ((local_bc == 0) && (cVar4 = (char)puVar28[-7], cVar4 != '\v')) {
        if (cVar4 == '\v') {
          if (puVar28[-1] != 0xffffffff) {
            pgVar30 = gen_ctx;
            combine_process_var(gen_ctx,puVar28[-1],pbVar19);
          }
          bb_insn_ref = (bb_insn_t_conflict *)(ulong)*puVar28;
          if (*puVar28 != 0xffffffff) goto LAB_00170f63;
        }
        else if (cVar4 == '\x02') {
          bb_insn_ref = (bb_insn_t_conflict *)(ulong)puVar28[-5];
LAB_00170f63:
          pgVar30 = gen_ctx;
          combine_process_var(gen_ctx,(MIR_reg_t)bb_insn_ref,pbVar19);
        }
      }
      sVar27 = sVar27 + 1;
      puVar28 = puVar28 + 0xc;
    } while (local_b8 != sVar27);
    if (((insn->func_redef_permission_p & 0xfffffffcU) != 0) ||
       (*(char *)&(insn->environment_module).name != '\x02')) goto LAB_00171048;
    pVVar23 = gen_ctx->combine_ctx->insn_vars;
    if (pVVar23 != (VARR_MIR_reg_t *)0x0) {
      if (pVVar23->els_num == 0) {
LAB_00171048:
        pVVar23 = gen_ctx->combine_ctx->insn_vars;
        if (pVVar23 == (VARR_MIR_reg_t *)0x0) {
LAB_00171508:
          combine_substitute_cold_8();
LAB_00171510:
          combine_substitute_cold_7();
LAB_00171518:
          __assert_fail("op_ref->mode != MIR_OP_VAR_MEM || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x228a,"int combine_substitute(gen_ctx_t, bb_insn_t *, long *)");
        }
        local_b0 = (bb_insn_t_conflict *)((long)&insn->used_label_p + 4);
        pMVar32 = (MIR_op_t *)&insn->insn_nops;
        uVar29 = 0;
        local_70 = local_b8 - 1;
LAB_00171078:
        sVar27 = pVVar23->els_num;
        if (sVar27 != 0) {
          if (pVVar23->varr != (MIR_reg_t *)0x0) {
            pVVar23->els_num = sVar27 - 1;
            MVar5 = pVVar23->varr[sVar27 - 1];
            pMVar22 = get_uptodate_def_insn(gen_ctx,MVar5);
            if ((pMVar22 != (MIR_insn_t)0x0) && ((*(uint *)&pMVar22->field_0x18 & 0xfffffffc) == 0))
            {
              local_78 = pMVar22 + 1;
              bVar24 = true;
              sVar27 = 0;
              local_98 = pMVar32;
              local_90 = uVar29;
              do {
                ppbVar33 = local_b0 + sVar27 * 6;
                nop = sVar27;
                while( true ) {
                  bb_insn_ref = (bb_insn_t_conflict *)insn;
                  pgVar30 = local_80;
                  MIR_insn_op_mode((MIR_context_t)local_80,(MIR_insn_t_conflict)insn,nop,&local_bc);
                  if (((local_bc == 0) && (*(char *)((long)ppbVar33 + -0x1c) == '\x02')) &&
                     (*(MIR_reg_t *)((long)ppbVar33 + -0x14) == MVar5)) break;
                  if ((*(char *)((long)ppbVar33 + -0x1c) == '\v') &&
                     ((*(MIR_reg_t *)((long)ppbVar33 + -4) == MVar5 ||
                      (*(MIR_reg_t *)ppbVar33 == MVar5)))) goto LAB_00171518;
                  nop = nop + 1;
                  ppbVar33 = ppbVar33 + 6;
                  if (local_b8 == nop) {
                    uVar29 = local_90;
                    pMVar32 = local_98;
                    if (bVar24) goto LAB_001710ba;
                    goto LAB_001711fd;
                  }
                }
                auVar3 = *(undefined1 (*) [32])local_78;
                *(undefined1 (*) [32])((long)ppbVar33 + -0x14) =
                     *(undefined1 (*) [32])&(local_78->insn_link).next;
                *(undefined1 (*) [32])((long)ppbVar33 + -0x24) = auVar3;
                pVVar9 = gen_ctx->combine_ctx->changed_op_numbers;
                __ptr_00 = pVVar9->varr;
                if (__ptr_00 == (size_t *)0x0) goto LAB_0017156c;
                sVar27 = pVVar9->els_num;
                uVar25 = sVar27 + 1;
                if (pVVar9->size < uVar25) {
                  sVar27 = (uVar25 >> 1) + uVar25;
                  __ptr_00 = (size_t *)realloc(__ptr_00,sVar27 * 8);
                  pVVar9->varr = __ptr_00;
                  pVVar9->size = sVar27;
                  sVar27 = pVVar9->els_num;
                  uVar25 = sVar27 + 1;
                }
                pVVar9->els_num = uVar25;
                __ptr_00[sVar27] = nop;
                sVar27 = nop + 1;
                bVar24 = false;
              } while (local_70 != nop);
LAB_001711fd:
              bb_insn_ref = (bb_insn_t_conflict *)insn;
              pgVar30 = gen_ctx;
              iVar20 = find_insn_pattern(gen_ctx,(MIR_insn_t)insn,(int *)0x0);
              pbVar19 = local_88;
              pMVar32 = local_98;
              pcVar7 = gen_ctx->combine_ctx;
              pVVar9 = pcVar7->changed_op_numbers;
              do {
                if (pVVar9 == (VARR_size_t *)0x0) {
LAB_00171547:
                  combine_substitute_cold_5();
LAB_0017154f:
                  combine_substitute_cold_4();
                  goto LAB_00171557;
                }
                bb_insn_ref = (bb_insn_t_conflict *)pVVar9->els_num;
                if ((MIR_context_t)bb_insn_ref == (MIR_context_t)0x0) goto LAB_001712ff;
                pgVar30 = (gen_ctx_t)pVVar9->varr;
                if (pgVar30 == (gen_ctx_t)0x0) goto LAB_0017154f;
                pVVar9->els_num =
                     (size_t)((long)&((MIR_context_t)((long)bb_insn_ref + -0x118))->wrapper_end_addr
                             + 7);
                bb_insn_ref = (bb_insn_t_conflict *)
                              pgVar30->call_used_hard_regs
                              [(long)((long)&((MIR_context_t)((long)bb_insn_ref + -0x118))->
                                             setjmp_addr + 2)];
                if (iVar20 < 0) {
                  pgVar30 = (gen_ctx_t)pcVar7->last_right_ops;
                  if (((pgVar30 == (gen_ctx_t)0x0) ||
                      (pMVar10 = pgVar30->curr_func_item, pMVar10 == (MIR_item_t)0x0)) ||
                     (pgVar30->ctx <= bb_insn_ref)) goto LAB_0017153f;
                  pgVar30 = *(gen_ctx_t *)(&pMVar10->item_type + (long)bb_insn_ref * 0xc);
                  auVar3 = *(undefined1 (*) [32])(&pMVar10->data + (long)bb_insn_ref * 6);
                  pMVar2 = local_98 + (long)bb_insn_ref;
                  *(gen_ctx_t *)((long)&pMVar2->u + 0x10) = pgVar30;
                  pMVar10 = (&pMVar10->ref_def)[(long)bb_insn_ref * 6];
                  *(undefined1 (*) [32])pMVar2 = auVar3;
                  (pMVar2->u).mem.disp = (MIR_disp_t)pMVar10;
                }
                else {
                  pgVar30 = (gen_ctx_t)pcVar7->last_right_ops;
                  if (((pgVar30 == (gen_ctx_t)0x0) ||
                      (pMVar10 = pgVar30->curr_func_item, pMVar10 == (MIR_item_t)0x0)) ||
                     (pgVar30->ctx <= bb_insn_ref)) {
                    combine_substitute_cold_2();
LAB_0017153f:
                    combine_substitute_cold_3();
                    goto LAB_00171547;
                  }
                  auVar3 = *(undefined1 (*) [32])(local_98 + (long)bb_insn_ref);
                  *(undefined1 (*) [16])(&pMVar10->item_type + (long)bb_insn_ref * 0xc) =
                       *(undefined1 (*) [16])((long)&local_98[(long)bb_insn_ref].u + 0x10);
                  *(undefined1 (*) [32])(&pMVar10->data + (long)bb_insn_ref * 6) = auVar3;
                }
                bb_insn_ref = (bb_insn_t_conflict *)(local_98 + (long)bb_insn_ref);
                pcVar7 = gen_ctx->combine_ctx;
                pVVar9 = pcVar7->changed_op_numbers;
              } while( true );
            }
            goto LAB_001710ba;
          }
          goto LAB_00171510;
        }
        goto LAB_00170dba;
      }
      if (pVVar23->varr != (MIR_reg_t *)0x0) {
        MVar5 = pVVar23->varr[pVVar23->els_num - 1];
        if (MVar5 == *(MIR_reg_t *)&(insn->environment_module).items.head) {
          pMVar22 = get_uptodate_def_insn(gen_ctx,MVar5);
          uVar29 = 0;
          if (pMVar22 != (MIR_insn_t)0x0) {
            uVar21 = (uint)*(MIR_insn_t *)&pMVar22->field_0x18;
            if (uVar21 - 0xaa < 0xfffffffd) {
              target_get_early_clobbered_hard_regs
                        (*(MIR_insn_t *)&pMVar22->field_0x18,&local_a4,&local_a8);
              if ((((uVar21 < 4) || (local_a4 != 0xffffffff)) || (local_a8 != 0xffffffff)) ||
                 (((*(char *)&(insn->environment_module).name != '\x02' ||
                   (*(MIR_reg_t *)&(insn->environment_module).items.head != MVar5)) ||
                  ((*(char *)&insn->unspec_protos == '\v' &&
                   ((*(MIR_reg_t *)&insn->used_label_p == MVar5 ||
                    (*(MIR_reg_t *)((long)&insn->used_label_p + 4) == MVar5))))))))
              goto LAB_00171048;
              uVar29 = 0;
              pvStack_68 = pMVar22->ops[0].data;
              uStack_60 = *(undefined8 *)&pMVar22->ops[0].field_0x8;
              local_58 = pMVar22->ops[0].u.i;
              pcStack_50 = pMVar22->ops[0].u.str.s;
              uStack_48 = *(undefined8 *)((long)&pMVar22->ops[0].u + 0x10);
              MStack_40 = pMVar22->ops[0].u.mem.disp;
              pvVar12 = ((MIR_op_t *)&insn->insn_nops)->data;
              pVVar13 = insn->unspec_protos;
              sVar27 = (((anon_union_32_12_57d33f68_for_u *)&insn->temp_string)->str).len;
              pVVar14 = insn->temp_data;
              pVVar15 = insn->temp_data;
              pVVar16 = insn->used_label_p;
              pHVar17 = insn->module_item_tab;
              pMVar22->ops[0].u.i =
                   (((anon_union_32_12_57d33f68_for_u *)&insn->temp_string)->str).len;
              pMVar22->ops[0].u.str.s = (char *)pVVar15;
              *(VARR_uint8_t **)((long)&pMVar22->ops[0].u + 0x10) = pVVar16;
              pMVar22->ops[0].u.mem.disp = (MIR_disp_t)pHVar17;
              pMVar22->ops[0].data = pvVar12;
              *(VARR_MIR_proto_t **)&pMVar22->ops[0].field_0x8 = pVVar13;
              pMVar22->ops[0].u.i = sVar27;
              pMVar22->ops[0].u.str.s = (char *)pVVar14;
              iVar20 = find_insn_pattern(gen_ctx,pMVar22,(int *)0x0);
              pMVar22->ops[0].data = pvStack_68;
              *(undefined8 *)&pMVar22->ops[0].field_0x8 = uStack_60;
              pMVar22->ops[0].u.i = local_58;
              pMVar22->ops[0].u.str.s = pcStack_50;
              pMVar22->ops[0].u.i = local_58;
              pMVar22->ops[0].u.str.s = pcStack_50;
              *(undefined8 *)((long)&pMVar22->ops[0].u + 0x10) = uStack_48;
              pMVar22->ops[0].u.mem.disp = MStack_40;
              if (-1 < iVar20) {
                gen_move_insn_before(gen_ctx,(MIR_insn_t)insn,pMVar22);
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fwrite("      moving insn ",0x12,1,(FILE *)gen_ctx->debug_file);
                  print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar22->data,0);
                  fwrite("      before insn ",0x12,1,(FILE *)gen_ctx->debug_file);
                  print_bb_insn(gen_ctx,pbVar19,1);
                }
                pvVar12 = ((MIR_op_t *)&insn->insn_nops)->data;
                pVVar13 = insn->unspec_protos;
                sVar27 = (((anon_union_32_12_57d33f68_for_u *)&insn->temp_string)->str).len;
                pVVar14 = insn->temp_data;
                pVVar15 = insn->temp_data;
                pVVar16 = insn->used_label_p;
                pHVar17 = insn->module_item_tab;
                pMVar22->ops[0].u.i =
                     (((anon_union_32_12_57d33f68_for_u *)&insn->temp_string)->str).len;
                pMVar22->ops[0].u.str.s = (char *)pVVar15;
                *(VARR_uint8_t **)((long)&pMVar22->ops[0].u + 0x10) = pVVar16;
                pMVar22->ops[0].u.mem.disp = (MIR_disp_t)pHVar17;
                pMVar22->ops[0].data = pvVar12;
                *(VARR_MIR_proto_t **)&pMVar22->ops[0].field_0x8 = pVVar13;
                pMVar22->ops[0].u.i = sVar27;
                pMVar22->ops[0].u.str.s = (char *)pVVar14;
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fwrite("      changing it to ",0x15,1,(FILE *)gen_ctx->debug_file);
                  print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar22->data,1);
                  fwrite("      deleting insn ",0x14,1,(FILE *)gen_ctx->debug_file);
                  print_bb_insn(gen_ctx,pbVar19,1);
                }
                gen_delete_insn(gen_ctx,(MIR_insn_t)insn);
                uVar29 = 1;
                *local_a0 = *local_a0 + 1;
                *local_b0 = (bb_insn_t_conflict)pMVar22->data;
              }
            }
          }
LAB_00170dba:
          return (int)uVar29;
        }
        goto LAB_00171048;
      }
      goto LAB_00171579;
    }
  }
  combine_substitute_cold_9();
LAB_00171579:
  combine_substitute_cold_1();
  if ((int)bb_insn_ref != -1) {
    pcVar7 = pgVar30->combine_ctx;
    if (pcVar7->var_ref_ages == (VARR_size_t *)0x0) {
      safe_var_substitution_p_cold_1();
      if (cStack_c0 == '\v') {
        if ((local_a8 != 0xffffffff) &&
           (iVar20 = obsolete_var_p((gen_ctx_t)pgVar30->combine_ctx,local_a8,(size_t)bb_insn_ref),
           iVar20 != 0)) {
          return 1;
        }
        if ((local_a4 != 0xffffffff) &&
           (iVar20 = obsolete_var_p((gen_ctx_t)pgVar30->combine_ctx,local_a4,(size_t)bb_insn_ref),
           iVar20 != 0)) {
          return 1;
        }
        uVar21 = (uint)(bb_insn_ref < (MIR_context_t)pgVar30->combine_ctx->last_mem_ref_insn_num);
      }
      else {
        uVar21 = 0;
        if (cStack_c0 == '\x02') {
          iVar20 = obsolete_var_p((gen_ctx_t)pgVar30->combine_ctx,(MIR_reg_t)local_b8,
                                  (size_t)bb_insn_ref);
          return iVar20;
        }
      }
      return uVar21;
    }
    uVar25 = (ulong)bb_insn_ref & 0xffffffff;
    if (((uVar25 < pcVar7->var_ref_ages->els_num) &&
        (pcVar7->var_ref_ages_addr[uVar25] == pcVar7->curr_bb_var_ref_age)) &&
       (pcVar7->var_refs_addr[uVar25].def_p != '\0')) {
      for (piVar26 = *(int **)(extraout_RDX + 0x38); piVar26 != (int *)0x0;
          piVar26 = *(int **)(piVar26 + 4)) {
        if (*piVar26 == (int)bb_insn_ref) {
          return 1;
        }
      }
    }
  }
  return 0;
LAB_001712ff:
  uVar29 = local_90;
  if (-1 < iVar20) {
    iVar20 = combine_delete_insn(gen_ctx,pMVar22,local_88);
    if (iVar20 != 0) {
      *local_a0 = *local_a0 + 1;
    }
    uVar29 = 1;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("      changing to ",0x12,1,(FILE *)gen_ctx->debug_file);
      print_bb_insn(gen_ctx,pbVar19,1);
      uVar29 = 1;
    }
  }
LAB_001710ba:
  pVVar23 = gen_ctx->combine_ctx->insn_vars;
  if (pVVar23 == (VARR_MIR_reg_t *)0x0) goto LAB_00171508;
  goto LAB_00171078;
}

Assistant:

static int combine_substitute (gen_ctx_t gen_ctx, bb_insn_t *bb_insn_ref, long *deleted_insns_num) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_insn_t bb_insn = *bb_insn_ref;
  MIR_insn_t insn = bb_insn->insn, def_insn;
  size_t i, nops = insn->nops;
  int out_p, insn_change_p, insn_var_change_p, op_change_p, success_p;
  MIR_op_t *op_ref, saved_op;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;

  if (nops == 0) return FALSE;
  VARR_TRUNC (MIR_op_t, last_right_ops, 0);
  for (i = 0; i < nops; i++) VARR_PUSH (MIR_op_t, last_right_ops, insn->ops[i]);
  VARR_TRUNC (MIR_reg_t, insn_vars, 0);
  bitmap_clear (vars_bitmap);
  for (i = 0; i < nops; i++) {
    MIR_insn_op_mode (ctx, insn, i, &out_p);
    if (out_p || insn->ops[i].mode == MIR_OP_VAR_MEM) continue;
    combine_process_op (gen_ctx, &insn->ops[i], bb_insn);
  }

  if (move_code_p (insn->code) && insn->ops[1].mode == MIR_OP_VAR
      && VARR_LENGTH (MIR_reg_t, insn_vars) != 0
      && VARR_LAST (MIR_reg_t, insn_vars) == insn->ops[1].u.var) {
    /* We can change move src.  Try to change insn the following way:
       r0 = r2 op r3; ...; ... = r0  =>  ...; ... = r2 op r3 */
    var = insn->ops[1].u.var;
    if ((def_insn = get_uptodate_def_insn (gen_ctx, var)) == NULL
        || MIR_call_code_p (def_insn->code))
      return FALSE;
    target_get_early_clobbered_hard_regs (def_insn, &early_clobbered_hard_reg1,
                                          &early_clobbered_hard_reg2);
    if (!move_code_p (def_insn->code) && early_clobbered_hard_reg1 == MIR_NON_VAR
        && early_clobbered_hard_reg2 == MIR_NON_VAR && insn->ops[1].mode == MIR_OP_VAR
        && insn->ops[1].u.var == var
        /* Check that insn->ops[0] is not mem[...hr0...]: */
        && (insn->ops[0].mode != MIR_OP_VAR_MEM
            || (insn->ops[0].u.var_mem.base != var && insn->ops[0].u.var_mem.index != var))) {
      saved_op = def_insn->ops[0];
      def_insn->ops[0] = insn->ops[0];
      success_p = target_insn_ok_p (gen_ctx, def_insn);
      def_insn->ops[0] = saved_op;
      if (!success_p) return FALSE;
      gen_move_insn_before (gen_ctx, insn, def_insn);
      DEBUG (2, {
        fprintf (debug_file, "      moving insn ");
        print_bb_insn (gen_ctx, def_insn->data, FALSE);
        fprintf (debug_file, "      before insn ");
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      });
      def_insn->ops[0] = insn->ops[0];
      DEBUG (2, {
        fprintf (debug_file, "      changing it to ");
        print_bb_insn (gen_ctx, def_insn->data, TRUE);
        fprintf (debug_file, "      deleting insn ");
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      });
      gen_delete_insn (gen_ctx, insn);
      (*deleted_insns_num)++;
      *bb_insn_ref = def_insn->data;
      return TRUE;
    }
  }
  insn_change_p = FALSE;
  while (VARR_LENGTH (MIR_reg_t, insn_vars) != 0) {
    var = VARR_POP (MIR_reg_t, insn_vars);
    if ((def_insn = get_uptodate_def_insn (gen_ctx, var)) == NULL) continue;
    if (!move_code_p (def_insn->code)) continue;
    insn_var_change_p = FALSE;
    for (i = 0; i < nops; i++) { /* Change all var occurences: */
      op_ref = &insn->ops[i];
      op_change_p = FALSE;
      MIR_insn_op_mode (ctx, insn, i, &out_p);
      if (!out_p && op_ref->mode == MIR_OP_VAR && op_ref->u.var == var) {
        /* It is not safe to substitute if there is another use after def insn before
           the current as we delete def insn after substitution. */
        insn->ops[i] = def_insn->ops[1];
        insn_var_change_p = op_change_p = TRUE;
      } else {
        gen_assert (op_ref->mode != MIR_OP_VAR_MEM
                    || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var));
      }
      if (op_change_p) VARR_PUSH (size_t, changed_op_numbers, i);
    }
    if (insn_var_change_p) {
      if ((success_p = i >= nops && target_insn_ok_p (gen_ctx, insn))) insn_change_p = TRUE;
      while (VARR_LENGTH (size_t, changed_op_numbers)) {
        i = VARR_POP (size_t, changed_op_numbers);
        if (success_p)
          VARR_SET (MIR_op_t, last_right_ops, i, insn->ops[i]);
        else
          insn->ops[i] = VARR_GET (MIR_op_t, last_right_ops, i); /* restore changed operands */
      }
      if (success_p) {
        gen_assert (def_insn != NULL);
        if (combine_delete_insn (gen_ctx, def_insn, bb_insn)) (*deleted_insns_num)++;
        DEBUG (2, {
          fprintf (debug_file, "      changing to ");
          print_bb_insn (gen_ctx, bb_insn, TRUE);
        });
      }
    }
  }
  return insn_change_p;
}